

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void HMAC_SHA256_Init_Y(HMAC_SHA256_CTX_Y *ctx,void *_K,size_t Klen)

{
  ulong in_RDX;
  uchar *in_RSI;
  SHA256_CTX_Y *in_RDI;
  size_t i;
  uchar *K;
  uchar khash [32];
  uchar pad [64];
  SHA256_CTX_Y *in_stack_ffffffffffffff78;
  ulong uVar1;
  uchar local_78 [8];
  size_t in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  SHA256_CTX_Y *in_stack_ffffffffffffffa0;
  byte local_58 [64];
  ulong local_18;
  SHA256_CTX_Y *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (0x40 < in_RDX) {
    SHA256_Init_Y(in_RDI);
    SHA256_Update_Y(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    SHA256_Final_Y(in_RSI,in_stack_ffffffffffffff78);
    in_RSI = local_78;
    local_18 = 0x20;
  }
  SHA256_Init_Y(local_8);
  memset(local_58,0x36,0x40);
  for (uVar1 = 0; uVar1 < local_18; uVar1 = uVar1 + 1) {
    local_58[uVar1] = local_58[uVar1] ^ in_RSI[uVar1];
  }
  SHA256_Update_Y(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  SHA256_Init_Y(local_8 + 1);
  memset(local_58,0x5c,0x40);
  for (uVar1 = 0; uVar1 < local_18; uVar1 = uVar1 + 1) {
    local_58[uVar1] = local_58[uVar1] ^ in_RSI[uVar1];
  }
  SHA256_Update_Y(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  memset(local_78,0,0x20);
  return;
}

Assistant:

void
HMAC_SHA256_Init_Y(HMAC_SHA256_CTX_Y * ctx, const void * _K, size_t Klen)
{
	unsigned char pad[64];
	unsigned char khash[32];
	const unsigned char * K = _K;
	size_t i;

	/* If Klen > 64, the key is really SHA256(K). */
	if (Klen > 64) {
		SHA256_Init_Y(&ctx->ictx);
		SHA256_Update_Y(&ctx->ictx, K, Klen);
		SHA256_Final_Y(khash, &ctx->ictx);
		K = khash;
		Klen = 32;
	}

	/* Inner SHA256 operation is SHA256(K xor [block of 0x36] || data). */
	SHA256_Init_Y(&ctx->ictx);
	memset(pad, 0x36, 64);
	for (i = 0; i < Klen; i++)
		pad[i] ^= K[i];
	SHA256_Update_Y(&ctx->ictx, pad, 64);

	/* Outer SHA256 operation is SHA256(K xor [block of 0x5c] || hash). */
	SHA256_Init_Y(&ctx->octx);
	memset(pad, 0x5c, 64);
	for (i = 0; i < Klen; i++)
		pad[i] ^= K[i];
	SHA256_Update_Y(&ctx->octx, pad, 64);

	/* Clean the stack. */
	memset(khash, 0, 32);
}